

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivision_geometry_device.cpp
# Opt level: O3

void device_init(char *cfg)

{
  embree::g_scene = (RTCScene)rtcNewScene(g_device);
  embree::addGroundPlane(embree::g_scene);
  embree::addCube(embree::g_scene);
  rtcCommitScene(embree::g_scene);
  return;
}

Assistant:

void device_init (char* cfg)
{
  /* create scene */
  g_scene = rtcNewScene(g_device);

  /* add ground plane */
  addGroundPlane(g_scene);

  /* add cube */
  addCube(g_scene);

  /* commit changes to scene */
  rtcCommitScene (g_scene);
}